

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O3

int rops_close_kill_connection_ws(lws *wsi,lws_close_status reason)

{
  int iVar1;
  
  if ((~*(uint *)&wsi->field_0x2dc & 0x12) == 0) {
    iVar1 = rops_close_kill_connection_h2(wsi,reason);
    return iVar1;
  }
  return 0;
}

Assistant:

static int
rops_close_kill_connection_ws(struct lws *wsi, enum lws_close_status reason)
{
	/* deal with ws encapsulation in h2 */
#if defined(LWS_WITH_HTTP2)
	if (wsi->mux_substream && wsi->h2_stream_carries_ws)
		return role_ops_h2.close_kill_connection(wsi, reason);

	return 0;
#else
	return 0;
#endif
}